

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

bool __thiscall
capnp::compiler::NodeTranslator::compileType
          (NodeTranslator *this,Reader source,Builder target,ImplicitParams implicitMethodParams)

{
  BrandScope *pBVar1;
  undefined8 uVar2;
  bool bVar3;
  BrandedDecl local_168;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_c0;
  
  BrandScope::compileDeclExpression
            (&local_c0,(this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  uVar2 = local_c0.ptr.field_1.value.brand.ptr;
  if (local_c0.ptr.isSet == true) {
    if (local_c0.ptr.field_1.value.body.tag == 2) {
      local_168.body.field_1.forceAligned = (void *)local_c0.ptr.field_1._8_8_;
      local_168.body.field_1._8_8_ = local_c0.ptr.field_1._16_8_;
    }
    else if (local_c0.ptr.field_1.value.body.tag == 1) {
      local_168.body.field_1._32_8_ = local_c0.ptr.field_1._40_8_;
      local_168.body.field_1._16_8_ = local_c0.ptr.field_1._24_8_;
      local_168.body.field_1._24_8_ = local_c0.ptr.field_1._32_8_;
      local_168.body.field_1.forceAligned = (void *)local_c0.ptr.field_1._8_8_;
      local_168.body.field_1._8_8_ = local_c0.ptr.field_1._16_8_;
      local_168.body.field_1.space[0x28] = local_c0.ptr.field_1._48_1_;
      if (local_c0.ptr.field_1._48_1_ == '\x01') {
        local_168.body.field_1._80_8_ = local_c0.ptr.field_1._88_8_;
        local_168.body.field_1._88_8_ = local_c0.ptr.field_1._96_8_;
        local_168.body.field_1._64_8_ = local_c0.ptr.field_1._72_8_;
        local_168.body.field_1._72_8_ = local_c0.ptr.field_1._80_8_;
        local_168.body.field_1._48_8_ = local_c0.ptr.field_1._56_8_;
        local_168.body.field_1._56_8_ = local_c0.ptr.field_1._64_8_;
      }
    }
    local_c0.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
    local_168.brand.ptr = (BrandScope *)uVar2;
    local_168.brand.disposer._4_4_ = local_c0.ptr.field_1._108_4_;
    local_168.brand.disposer._0_4_ = local_c0.ptr.field_1._104_4_;
    if (local_c0.ptr.field_1.value.body.tag == 1) {
      local_c0.ptr.field_1.value.body.tag = 0;
    }
    if (local_c0.ptr.field_1.value.body.tag == 2) {
      local_c0.ptr.field_1.value.body.tag = 0;
    }
  }
  if (local_c0.ptr.isSet == true) {
    bVar3 = BrandedDecl::compileAsType(&local_168,this->errorReporter,target);
    pBVar1 = local_168.brand.ptr;
    if (local_168.brand.ptr != (BrandScope *)0x0) {
      local_168.brand.ptr = (BrandScope *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_168.brand.disposer._4_4_,local_168.brand.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_168.brand.disposer._4_4_,local_168.brand.disposer._0_4_),
                 (pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool NodeTranslator::compileType(Expression::Reader source, schema::Type::Builder target,
                                 ImplicitParams implicitMethodParams) {
  KJ_IF_MAYBE(decl, compileDeclExpression(source, implicitMethodParams)) {
    return decl->compileAsType(errorReporter, target);
  } else {
    return false;
  }
}